

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O3

bool ipxStatusError(bool status_error,HighsOptions *options,string *message,int value)

{
  pointer pcVar1;
  HighsLogOptions *log_options_;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,status_error) != 0) {
    log_options_ = &(options->super_HighsOptionsStruct).log_options;
    pcVar1 = (message->_M_dataplus)._M_p;
    if (value < 0) {
      highsLogUser(log_options_,kError,"Ipx: %s\n",pcVar1);
    }
    else {
      highsLogUser(log_options_,kError,"Ipx: %s %d\n",pcVar1);
    }
    fflush((FILE *)0x0);
  }
  return status_error;
}

Assistant:

bool ipxStatusError(const bool status_error, const HighsOptions& options,
                    std::string message, const int value) {
  if (status_error) {
    if (value < 0) {
      highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s\n",
                   message.c_str());
    } else {
      highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s %d\n",
                   message.c_str(), value);
    }
    fflush(NULL);
  }
  assert(!status_error);
  return status_error;
}